

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t _elemsize;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Option *pOVar11;
  uint uVar12;
  int top;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  size_t local_118;
  Mat m;
  int _axes [4];
  size_t local_a8;
  int local_8c;
  int local_88;
  size_t local_80;
  Mat borderm;
  void *pvVar16;
  
  uVar7 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar8 = bottom_blob->c;
  iVar10 = bottom_blob->dims;
  _elemsize = bottom_blob->elemsize;
  iVar18 = this->woffset;
  top = this->hoffset;
  iVar20 = this->coffset;
  iVar17 = this->woffset2;
  iVar1 = this->hoffset2;
  pvVar16 = (this->starts).data;
  local_118 = _elemsize;
  uVar19 = uVar7;
  if ((((pvVar16 == (void *)0x0) ||
       (local_118 = (long)(this->starts).c * (this->starts).cstep, local_118 == 0)) ||
      (pvVar3 = (this->ends).data, pvVar3 == (void *)0x0)) ||
     (local_118 = (long)(this->ends).c * (this->ends).cstep, local_118 == 0)) {
    if (iVar10 == 3) {
      uVar12 = this->outw;
      iVar17 = iVar17 + iVar18;
      if (iVar20 == -0xe9 && top == -0xe9) {
        uVar5 = uVar8 - iVar17;
        local_118 = (size_t)uVar5;
        if ((uVar12 != 0xffffff17) && (local_118 = (size_t)uVar5, (int)uVar12 <= (int)uVar5)) {
          local_118 = (size_t)uVar12;
        }
        iVar20 = iVar18;
        top = 0;
        uVar9 = uVar14;
      }
      else {
        uVar5 = this->outh;
        if (top != -0xe9) {
          uVar9 = uVar7 - iVar17;
          uVar19 = uVar12;
          if ((int)uVar9 < (int)uVar12) {
            uVar19 = uVar9;
          }
          if (uVar12 == 0xffffff17) {
            uVar19 = uVar9;
          }
          uVar12 = uVar14 - (iVar1 + top);
          uVar9 = uVar5;
          if ((int)uVar12 < (int)uVar5) {
            uVar9 = uVar12;
          }
          if (uVar5 == 0xffffff17) {
            uVar9 = uVar12;
          }
          uVar12 = this->outc;
          uVar5 = uVar8 - (this->coffset2 + iVar20);
          local_118 = (size_t)uVar5;
          if ((uVar12 != 0xffffff17) && (local_118 = (size_t)uVar5, (int)uVar12 <= (int)uVar5)) {
            local_118 = (size_t)uVar12;
          }
          goto LAB_00125206;
        }
        uVar6 = uVar14 - iVar17;
        uVar9 = uVar12;
        if ((int)uVar6 < (int)uVar12) {
          uVar9 = uVar6;
        }
        if (uVar12 == 0xffffff17) {
          uVar9 = uVar6;
        }
        uVar12 = (uVar8 - iVar1) + 0xe9;
        local_118 = (size_t)uVar12;
        if ((uVar5 != 0xffffff17) && (local_118 = (size_t)uVar12, (int)uVar5 <= (int)uVar12)) {
          local_118 = (size_t)uVar5;
        }
        iVar20 = -0xe9;
        top = iVar18;
      }
      iVar18 = 0;
      goto LAB_00125206;
    }
    if (iVar10 != 2) {
      pOVar11 = opt;
      uVar19 = uVar14;
      if (iVar10 != 1) goto LAB_00125073;
      uVar14 = this->outw;
      uVar19 = uVar7 - (iVar17 + iVar18);
      if ((uVar14 != 0xffffff17) && ((int)uVar14 <= (int)uVar19)) {
        uVar19 = uVar14;
      }
      goto LAB_00125096;
    }
    uVar8 = this->outw;
    if (top == -0xe9) {
      uVar9 = uVar14 - (iVar17 + iVar18);
      iVar20 = 0;
      top = iVar18;
      if ((uVar8 != 0xffffff17) && ((int)uVar8 <= (int)uVar9)) {
        uVar9 = uVar8;
      }
    }
    else {
      uVar12 = uVar7 - (iVar17 + iVar18);
      uVar19 = uVar8;
      if ((int)uVar12 < (int)uVar8) {
        uVar19 = uVar12;
      }
      if (uVar8 == 0xffffff17) {
        uVar19 = uVar12;
      }
      uVar8 = this->outh;
      uVar9 = uVar14 - (iVar1 + top);
      iVar20 = iVar18;
      if ((uVar8 != 0xffffff17) && ((int)uVar8 <= (int)uVar9)) {
        uVar9 = uVar8;
      }
    }
  }
  else {
    pvVar4 = (this->axes).data;
    _axes[0] = 0;
    _axes[1] = 1;
    _axes[2] = 2;
    _axes[3] = 3;
    uVar12 = (this->axes).w;
    if (uVar12 == 0) {
      iVar18 = -1;
      if (-1 < iVar10) {
        iVar18 = iVar10;
      }
      uVar13 = (ulong)(iVar18 + 1);
    }
    else {
      uVar15 = 0;
      uVar13 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar13 = uVar15;
      }
      for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        iVar18 = *(int *)((long)pvVar4 + uVar15 * 4);
        _axes[uVar15] = (iVar18 >> 0x1f & iVar10 + 1U) + iVar18;
      }
    }
    pOVar11 = (Option *)(ulong)uVar14;
    local_118 = (size_t)uVar8;
    iVar20 = 0;
    top = 0;
    iVar18 = 0;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      iVar17 = _axes[uVar15];
      if (iVar17 != 0) {
        iVar1 = *(int *)((long)pvVar16 + uVar15 * 4);
        iVar2 = *(int *)((long)pvVar3 + uVar15 * 4);
        uVar12 = iVar1 >> 0x1f;
        if (iVar10 == 3) {
          if (iVar17 == 3) goto LAB_0012501f;
          if (iVar17 == 2) {
LAB_00125045:
            uVar5 = 0;
            if (iVar2 < 1) {
              uVar5 = uVar14;
            }
            top = (uVar12 & uVar14) + iVar1;
            uVar12 = uVar5 + iVar2;
            if ((int)uVar14 <= (int)(uVar5 + iVar2)) {
              uVar12 = uVar14;
            }
            pOVar11 = (Option *)(ulong)(uVar12 - iVar18);
          }
          else if (iVar17 == 1) {
            uVar5 = 0;
            if (iVar2 < 1) {
              uVar5 = uVar8;
            }
            iVar20 = (uVar12 & uVar8) + iVar1;
            uVar12 = uVar5 + iVar2;
            if ((int)uVar8 <= (int)(uVar5 + iVar2)) {
              uVar12 = uVar8;
            }
            local_118 = (size_t)(uVar12 - iVar20);
          }
        }
        else if (iVar10 == 2) {
          if (iVar17 == 2) goto LAB_0012501f;
          if (iVar17 == 1) goto LAB_00125045;
        }
        else if (iVar10 == 1) {
LAB_0012501f:
          uVar5 = 0;
          if (iVar2 < 1) {
            uVar5 = uVar7;
          }
          iVar18 = (uVar12 & uVar7) + iVar1;
          uVar19 = uVar5 + iVar2;
          if ((int)uVar7 <= (int)(uVar5 + iVar2)) {
            uVar19 = uVar7;
          }
          uVar19 = uVar19 - iVar18;
        }
      }
    }
LAB_00125073:
    uVar9 = (uint)pOVar11;
    if (iVar10 == 3) {
LAB_00125206:
      uVar14 = uVar14 ^ uVar9 | uVar7 ^ uVar19;
      pvVar16 = (void *)(ulong)uVar14;
      uVar7 = (uint)local_118;
      if ((uVar14 != 0) || (uVar7 != uVar8)) {
        uVar8 = uVar7;
        Mat::channel_range((Mat *)_axes,bottom_blob,iVar20,uVar7);
        if (uVar14 != 0) {
          Mat::create(top_blob,uVar19,uVar9,uVar7,_elemsize,opt->blob_allocator);
          iVar10 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar10 = 0;
            uVar13 = local_118 & 0xffffffff;
            if ((int)uVar7 < 1) {
              uVar13 = 0;
            }
            for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
              m.data = (void *)(local_80 * uVar15 * local_a8 + _axes._0_8_);
              m.refcount = (int *)0x0;
              m.dims = 2;
              m.c = 1;
              m.cstep = (size_t)(local_88 * local_8c);
              Mat::channel(&borderm,top_blob,(int)uVar15);
              if (_elemsize == 4) {
                copy_cut_border_image<float>(&m,&borderm,top,iVar18);
              }
              else if (_elemsize == 1) {
                copy_cut_border_image<signed_char>(&m,&borderm,top,iVar18);
              }
              Mat::~Mat(&borderm);
              Mat::~Mat(&m);
            }
          }
        }
        else {
          Mat::clone(&m,(__fn *)_axes,(void *)0x0,uVar8,pvVar16);
          Mat::operator=(top_blob,&m);
          Mat::~Mat(&m);
          if ((top_blob->data == (void *)0x0) ||
             (iVar10 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
            iVar10 = -100;
          }
        }
        Mat::~Mat((Mat *)_axes);
        return iVar10;
      }
      goto LAB_0012521a;
    }
    iVar20 = iVar18;
    if (iVar10 != 2) {
      if (iVar10 != 1) {
        return 0;
      }
LAB_00125096:
      if (uVar19 != uVar7) {
        Mat::create(top_blob,uVar19,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == 4) {
          top = 0;
          goto LAB_0012540b;
        }
        if (_elemsize != 1) {
          return 0;
        }
        top = 0;
        goto LAB_0012518a;
      }
      goto LAB_0012521a;
    }
  }
  iVar18 = iVar20;
  if ((uVar19 != uVar7) || (uVar9 != uVar14)) {
    Mat::create(top_blob,uVar19,uVar9,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (_elemsize == 4) {
LAB_0012540b:
      copy_cut_border_image<float>(bottom_blob,top_blob,top,iVar18);
      return 0;
    }
    if (_elemsize != 1) {
      return 0;
    }
LAB_0012518a:
    copy_cut_border_image<signed_char>(bottom_blob,top_blob,top,iVar18);
    return 0;
  }
LAB_0012521a:
  Mat::operator=(top_blob,bottom_blob);
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset = woffset;
    int _hoffset = hoffset;
    int _coffset = coffset;
    int _woffset2 = woffset2;
    int _hoffset2 = hoffset2;
    int _coffset2 = coffset2;
    int _outw;
    int _outh;
    int _outc;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0,1,2,3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims + 1;// +1 for N-dim
        }
        else
        {
            for (int i=0; i<num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + 1 + axis;// +1 for N-dim
                _axes[i] = axis;
            }
        }

        for (int i=0; i<num_axis; i++)
        {
            int axis = _axes[i];
            if (axis == 0)
                continue;// skip N-dim

            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 1
            {
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 1)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 2)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 1)
                {
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 2)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 3)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        if (dims == 1)
        {
            if (outw == -233)
                _outw = w - _woffset - _woffset2;
            else
                _outw = std::min(outw, w - _woffset - _woffset2);
        }
        if (dims == 2)
        {
            if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);
            }
        }
        if (dims == 3)
        {
            if (_hoffset == -233 && _coffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;
                _hoffset = 0;
                _hoffset2 = 0;
                _outh = h;

                _coffset = woffset;
                _coffset2 = woffset2;

                if (outw == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outw, channels - _coffset - _coffset2);
            }
            else if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);

                _coffset = hoffset;
                _coffset2 = hoffset2;

                if (outh == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outh, channels - _coffset - _coffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);

                if (outc == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outc, channels - _coffset - _coffset2);
            }
        }
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}